

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_data.cpp
# Opt level: O2

void duckdb::ArrowStructData::Initialize(ArrowAppendData *result,LogicalType *type,idx_t capacity)

{
  pointer ppVar1;
  child_list_t<LogicalType> *pcVar2;
  pointer ppVar3;
  unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
  child_buffer;
  shared_ptr<duckdb::ArrowTypeExtensionData,_true> local_48;
  
  pcVar2 = StructType::GetChildTypes_abi_cxx11_(type);
  ppVar1 = (pcVar2->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar3 = (pcVar2->
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
    local_48.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_48.internal.super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ArrowAppender::InitializeChild
              ((ArrowAppender *)&stack0xffffffffffffffc8,&ppVar3->second,capacity,&result->options,
               &local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.internal.
                super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArrowAppendData,std::default_delete<duckdb::ArrowAppendData>,true>>>
                *)&result->child_data,
               (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                *)&stack0xffffffffffffffc8);
    ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
    ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
                 *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void ArrowStructData::Initialize(ArrowAppendData &result, const LogicalType &type, idx_t capacity) {
	auto &children = StructType::GetChildTypes(type);
	for (auto &child : children) {
		auto child_buffer = ArrowAppender::InitializeChild(child.second, capacity, result.options);
		result.child_data.push_back(std::move(child_buffer));
	}
}